

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_projection_obvious(parser *p)

{
  uint uVar1;
  void *pvVar2;
  projection *projection;
  wchar_t obvious;
  parser *p_local;
  
  uVar1 = parser_getuint(p,"answer");
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    *(bool *)((long)pvVar2 + 0x58) = uVar1 == 1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_projection_obvious(struct parser *p) {
	int obvious = parser_getuint(p, "answer");
	struct projection *projection = parser_priv(p);

	if (!projection) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	projection->obvious = (obvious == 1) ? true : false;;
	return PARSE_ERROR_NONE;
}